

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

rk_s32 kmpp_obj_get_shm_obj(KmppObj obj,char *name,KmppObj *val)

{
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar1;
  anon_union_8_2_f7e366f2_for_KmppShmPtr_t_0 local_40;
  KmppShmPtr sptr;
  KmppObjImpl *impl;
  rk_s32 ret;
  KmppObj *val_local;
  char *name_local;
  KmppObj obj_local;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  impl._4_4_ = -1;
  if (((obj == (KmppObj)0x0) || (name == (char *)0x0)) || (val == (KmppObj *)0x0)) {
    _mpp_log_l(2,"kmpp_obj","obj %p get shm obj %s to %p failed invalid param\n",
               "kmpp_obj_get_shm_obj",obj,name,val);
  }
  else {
    sptr.field_1 = (anon_union_8_2_e6ce6506_for_KmppShmPtr_t_2)obj;
    memset(&local_40,0,0x10);
    *val = (KmppObj)0x0;
    impl._4_4_ = kmpp_obj_get_shm(obj,name,(KmppShmPtr *)&local_40);
    if ((impl._4_4_ == 0) && (local_40.uaddr != 0)) {
      impl._4_4_ = kmpp_obj_get_by_sptr(val,(KmppShmPtr *)&local_40,"kmpp_obj_get_shm_obj");
    }
    else {
      _mpp_log_l(2,"kmpp_obj","obj %p get shm %s failed ret %d\n","kmpp_obj_get_shm_obj",
                 sptr.field_1.kaddr,name,CONCAT44(uVar1,impl._4_4_));
    }
  }
  return impl._4_4_;
}

Assistant:

rk_s32 kmpp_obj_get_shm_obj(KmppObj obj, const char *name, KmppObj *val)
{
    rk_s32 ret = rk_nok;

    if (!obj || !name || !val) {
        mpp_loge_f("obj %p get shm obj %s to %p failed invalid param\n",
                   obj, name, val);
    } else {
        KmppObjImpl *impl = (KmppObjImpl *)obj;
        KmppShmPtr sptr = {0};

        *val = NULL;

        ret = kmpp_obj_get_shm(obj, name, &sptr);
        if (ret || !sptr.uptr) {
            mpp_loge_f("obj %p get shm %s failed ret %d\n", impl, name, ret);
        } else {
            ret = kmpp_obj_get_by_sptr(val, &sptr, __FUNCTION__);
        }
    }

    return ret;
}